

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O2

void __thiscall
CircularArrayTest_operator_brackets_Test::TestBody(CircularArrayTest_operator_brackets_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  
  ca.contents_._M_elems[0].moved = false;
  ca.contents_._M_elems[0].data = 0;
  ca.contents_._M_elems[0].data2 = 0;
  ca.contents_._M_elems[1].moved = false;
  ca.contents_._M_elems[1].data = 0;
  ca.contents_._M_elems[1].data2 = 0;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 3;
  ca.size_ = 0;
  ca.front_ = 0;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_._0_1_ = 0;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&ca,(value_type *)&gtest_ar);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_._0_1_ = 0;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 1;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&ca,(value_type *)&gtest_ar);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_68.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","ca[0].data",(int *)&local_68,
             &ca.contents_._M_elems[(uint)ca.front_ & 1].data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
               ,0x8c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_68.ptr_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"2","ca[1].data",(int *)&local_68,
               &ca.contents_._M_elems[~(uint)ca.front_ & 1].data);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
          (undefined8 *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                 ,0x8d,pcVar1);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&ca);
  return;
}

Assistant:

TEST_F(CircularArrayTest, operator_brackets) {
  CircularArray<TestObject, 2> ca;
  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, ca[0].data);
  ASSERT_EQ(2, ca[1].data);
}